

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O2

void __thiscall
bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short>::find_leaves
          (bwt_merger<dna_bwt_n<dna_string_n>,_unsigned_short> *this,sa_node_n x1,sa_node_n x2,
          uint64_t *m)

{
  sa_leaf L1;
  sa_leaf L1_00;
  sa_leaf L1_01;
  sa_leaf L1_02;
  sa_leaf L1_03;
  sa_leaf L1_04;
  sa_leaf L2;
  sa_leaf L2_00;
  sa_leaf L2_01;
  sa_leaf L2_02;
  sa_leaf L2_03;
  sa_leaf L2_04;
  uint64_t local_158;
  uint64_t local_150;
  uint64_t uStack_148;
  undefined8 local_140;
  uint64_t local_138;
  uint64_t uStack_130;
  undefined8 local_128;
  uint64_t local_120;
  uint64_t uStack_118;
  undefined8 local_110;
  uint64_t local_108;
  uint64_t uStack_100;
  undefined8 local_f8;
  uint64_t local_f0;
  uint64_t uStack_e8;
  undefined8 local_e0;
  uint64_t local_d8;
  uint64_t uStack_d0;
  undefined8 local_c8;
  uint64_t local_c0;
  uint64_t uStack_b8;
  undefined8 local_b0;
  uint64_t local_a8;
  uint64_t uStack_a0;
  undefined8 local_98;
  uint64_t local_90;
  uint64_t uStack_88;
  undefined8 local_80;
  uint64_t local_78;
  uint64_t uStack_70;
  undefined8 local_68;
  uint64_t local_60;
  uint64_t uStack_58;
  undefined8 local_50;
  uint64_t local_48;
  uint64_t uStack_40;
  undefined8 local_38;
  
  if (((x1.first_A - x1.first_TERM) - x2.first_TERM) + x2.first_A == 1) {
    local_158 = 0;
    local_d8 = x1.first_TERM;
    uStack_d0 = x1.first_A;
    local_c8 = 0;
    local_48 = x2.first_TERM;
    uStack_40 = x2.first_A;
    local_38 = 0;
    L1.depth = 0;
    L1.rn.first = SUB168(x1._0_16_,0);
    L1.rn.second = SUB168(x1._0_16_,8);
    L2.depth = 0;
    L2.rn.first = SUB168(x2._0_16_,0);
    L2.rn.second = SUB168(x2._0_16_,8);
    update_DA(this,L1,L2,false,&local_158,m);
  }
  if (((x1.first_C - x2.first_A) - x1.first_A) + x2.first_C == 1) {
    local_158 = 0;
    local_f0 = x1.first_A;
    uStack_e8 = x1.first_C;
    local_e0 = 0;
    local_60 = x2.first_A;
    uStack_58 = x2.first_C;
    local_50 = 0;
    L1_00.depth = 0;
    L1_00.rn.first = SUB168(x1._8_16_,0);
    L1_00.rn.second = SUB168(x1._8_16_,8);
    L2_00.depth = 0;
    L2_00.rn.first = SUB168(x2._8_16_,0);
    L2_00.rn.second = SUB168(x2._8_16_,8);
    update_DA(this,L1_00,L2_00,false,&local_158,m);
  }
  if (((x1.first_G - x2.first_C) - x1.first_C) + x2.first_G == 1) {
    local_158 = 0;
    local_108 = x1.first_C;
    uStack_100 = x1.first_G;
    local_f8 = 0;
    local_78 = x2.first_C;
    uStack_70 = x2.first_G;
    local_68 = 0;
    L1_01.depth = 0;
    L1_01.rn.first = SUB168(x1._16_16_,0);
    L1_01.rn.second = SUB168(x1._16_16_,8);
    L2_01.depth = 0;
    L2_01.rn.first = SUB168(x2._16_16_,0);
    L2_01.rn.second = SUB168(x2._16_16_,8);
    update_DA(this,L1_01,L2_01,false,&local_158,m);
  }
  if (((x1.first_N - x2.first_G) - x1.first_G) + x2.first_N == 1) {
    local_158 = 0;
    local_120 = x1.first_G;
    uStack_118 = x1.first_N;
    local_110 = 0;
    local_90 = x2.first_G;
    uStack_88 = x2.first_N;
    local_80 = 0;
    L1_02.depth = 0;
    L1_02.rn.first = SUB168(x1._24_16_,0);
    L1_02.rn.second = SUB168(x1._24_16_,8);
    L2_02.depth = 0;
    L2_02.rn.first = SUB168(x2._24_16_,0);
    L2_02.rn.second = SUB168(x2._24_16_,8);
    update_DA(this,L1_02,L2_02,false,&local_158,m);
  }
  if (((x1.first_T - x2.first_N) - x1.first_N) + x2.first_T == 1) {
    local_158 = 0;
    local_138 = x1.first_N;
    uStack_130 = x1.first_T;
    local_128 = 0;
    local_a8 = x2.first_N;
    uStack_a0 = x2.first_T;
    local_98 = 0;
    L1_03.depth = 0;
    L1_03.rn.first = SUB168(x1._32_16_,0);
    L1_03.rn.second = SUB168(x1._32_16_,8);
    L2_03.depth = 0;
    L2_03.rn.first = SUB168(x2._32_16_,0);
    L2_03.rn.second = SUB168(x2._32_16_,8);
    update_DA(this,L1_03,L2_03,false,&local_158,m);
  }
  if (((x1.last - x2.first_T) - x1.first_T) + x2.last == 1) {
    local_158 = 0;
    local_150 = x1.first_T;
    uStack_148 = x1.last;
    local_140 = 0;
    local_c0 = x2.first_T;
    uStack_b8 = x2.last;
    local_b0 = 0;
    L1_04.depth = 0;
    L1_04.rn.first = SUB168(x1._40_16_,0);
    L1_04.rn.second = SUB168(x1._40_16_,8);
    L2_04.depth = 0;
    L2_04.rn.first = SUB168(x2._40_16_,0);
    L2_04.rn.second = SUB168(x2._40_16_,8);
    update_DA(this,L1_04,L2_04,false,&local_158,m);
  }
  return;
}

Assistant:

void find_leaves(sa_node_n x1, sa_node_n x2, uint64_t & m){

		//find leaves that were ignored in the first pass
		if(range_length(child_TERM(x1))+range_length(child_TERM(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_TERM(x1),0};
			sa_leaf L2 = {child_TERM(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_A(x1))+range_length(child_A(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_A(x1),0};
			sa_leaf L2 = {child_A(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_C(x1))+range_length(child_C(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_C(x1),0};
			sa_leaf L2 = {child_C(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_G(x1))+range_length(child_G(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_G(x1),0};
			sa_leaf L2 = {child_G(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_N(x1))+range_length(child_N(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_N(x1),0};
			sa_leaf L2 = {child_N(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

		if(range_length(child_T(x1))+range_length(child_T(x2)) == 1){

			//symbolic depth = 0. It will not be used in update_DA
			sa_leaf L1 = {child_T(x1),0};
			sa_leaf L2 = {child_T(x2),0};

			uint64_t dummy = 0;
			update_DA(L1,L2,false,dummy,m);

		}

	}